

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database_tmpl_impl.hpp
# Opt level: O2

void hiberlite::Database::dbDeleteRows<long_long>
               (shared_connection *con,string *table,string *column,longlong value)

{
  longlong *val;
  string query;
  shared_connection local_130;
  longlong local_120;
  string local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_120 = value;
  std::operator+(&local_38,"DELETE FROM ",table);
  std::operator+(&local_d8,&local_38," WHERE ");
  std::operator+(&local_b8,&local_d8,column);
  std::operator+(&local_98,&local_b8,"=");
  Transformer::toSQLiteValue_abi_cxx11_(&local_f8,(Transformer *)&local_120,val);
  std::operator+(&local_78,&local_98,&local_f8);
  std::operator+(&local_58,&local_78,";");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_38);
  local_130._vptr_shared_res = (_func_int **)&PTR__shared_res_0018e7d0;
  local_130.res = con->res;
  if (local_130.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    (local_130.res)->refCount = (local_130.res)->refCount + 1;
  }
  std::__cxx11::string::string((string *)&local_118,(string *)&local_58);
  dbExecQuery(&local_130,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_130);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void Database::dbDeleteRows(shared_connection con, std::string table, std::string column, C value )
{
	std::string query="DELETE FROM "+table
					+ " WHERE "+column+"="+Transformer::toSQLiteValue(value)+";";
	dbExecQuery(con,query);
}